

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::pushEncryptionFilter(QPDFWriter *this,PipelinePopper *pp)

{
  element_type *peVar1;
  Count *pCVar2;
  ulong i;
  Pl_AES_PDF *this_00;
  uchar *puVar3;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_38;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->encrypted == true) && ((peVar1->cur_data_key)._M_string_length != 0)) {
    if (peVar1->encrypt_use_aes == true) {
      this_00 = (Pl_AES_PDF *)operator_new(0xa8);
      pCVar2 = peVar1->pipeline;
      puVar3 = QUtil::unsigned_char_pointer(&peVar1->cur_data_key);
      Pl_AES_PDF::Pl_AES_PDF
                (this_00,"aes stream encryption",&pCVar2->super_Pipeline,true,puVar3,
                 (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->cur_data_key)._M_string_length);
    }
    else {
      this_00 = (Pl_AES_PDF *)operator_new(0x58);
      pCVar2 = peVar1->pipeline;
      puVar3 = QUtil::unsigned_char_pointer(&peVar1->cur_data_key);
      i = (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          cur_data_key)._M_string_length;
      if ((i & 0xffffffff80000000) != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
      }
      Pl_RC4::Pl_RC4((Pl_RC4 *)this_00,"rc4 stream encryption",&pCVar2->super_Pipeline,puVar3,(int)i
                     ,0x10000);
    }
    pushPipeline(this,&this_00->super_Pipeline);
  }
  local_38._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
       (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
  activatePipelineStack
            (this,pp,false,(string *)0x0,
             (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_38);
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_38);
  return;
}

Assistant:

void
QPDFWriter::pushEncryptionFilter(PipelinePopper& pp)
{
    if (m->encrypted && (!m->cur_data_key.empty())) {
        Pipeline* p = nullptr;
        if (m->encrypt_use_aes) {
            p = new Pl_AES_PDF(
                "aes stream encryption",
                m->pipeline,
                true,
                QUtil::unsigned_char_pointer(m->cur_data_key),
                m->cur_data_key.length());
        } else {
            p = new Pl_RC4(
                "rc4 stream encryption",
                m->pipeline,
                QUtil::unsigned_char_pointer(m->cur_data_key),
                QIntC::to_int(m->cur_data_key.length()));
        }
        pushPipeline(p);
    }
    // Must call this unconditionally so we can call popPipelineStack to balance
    // pushEncryptionFilter().
    activatePipelineStack(pp);
}